

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O0

void __thiscall Diligent::VAOCache::VAOHashKey::VAOHashKey(VAOHashKey *this,VAOAttribs *Attribs)

{
  LayoutElement *pLVar1;
  bool bVar2;
  Int32 IVar3;
  GraphicsPipelineDesc *pGVar4;
  size_t sVar5;
  Char *pCVar6;
  BufferGLImpl *this_00;
  StreamAttribs *FirstArg;
  ulong uVar7;
  uint uVar8;
  char (*in_R8) [36];
  char (*in_stack_fffffffffffffe78) [8];
  int local_16c;
  Int32 local_14c;
  undefined1 local_138 [8];
  string msg_4;
  string msg_3;
  StreamAttribs *DstStream_1;
  StreamAttribs *DstStream;
  uint SlotBit;
  int BuffId;
  string msg_2;
  VertexStreamInfo<Diligent::BufferGLImpl> *SrcStream;
  undefined1 local_a9;
  char *local_a8;
  int local_9c;
  undefined1 local_98 [8];
  string msg_1;
  undefined1 local_68 [8];
  string msg;
  Uint32 BufferSlot;
  LayoutElement *LayoutElem;
  Uint32 i_1;
  LayoutElement *LayoutElements;
  InputLayoutDesc *InputLayout;
  Uint32 i;
  VAOAttribs *Attribs_local;
  VAOHashKey *this_local;
  
  IVar3 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
          ::GetUniqueID((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)Attribs->PSO);
  this->PsoUId = IVar3;
  if (Attribs->pIndexBuffer == (BufferGLImpl *)0x0) {
    local_14c = 0;
  }
  else {
    local_14c = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                               *)Attribs->pIndexBuffer);
  }
  this->IndexBufferUId = local_14c;
  this->UsedSlotsMask = 0;
  this->Hash = 0;
  for (InputLayout._4_4_ = 0; InputLayout._4_4_ < 0x20; InputLayout._4_4_ = InputLayout._4_4_ + 1) {
    this->Streams[InputLayout._4_4_].BufferUId = -1;
  }
  pGVar4 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                     (&Attribs->PSO->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  pLVar1 = (pGVar4->InputLayout).LayoutElements;
  sVar5 = ComputeHash<int,int>(&this->PsoUId,&this->IndexBufferUId);
  this->Hash = sVar5;
  for (LayoutElem._4_4_ = 0; LayoutElem._4_4_ < (pGVar4->InputLayout).NumElements;
      LayoutElem._4_4_ = LayoutElem._4_4_ + 1) {
    msg.field_2._12_4_ =
         *(undefined4 *)
          (*(char (*) [30])((ulong)LayoutElem._4_4_ * 0x28) + (long)&pLVar1->BufferSlot);
    if (0x1f < (uint)msg.field_2._12_4_) {
      FormatString<char[26],char[30]>
                ((string *)local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BufferSlot < MAX_BUFFER_SLOTS",
                 (char (*) [30])((ulong)LayoutElem._4_4_ * 0x28));
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VAOHashKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                 ,0xbd);
      std::__cxx11::string::~string((string *)local_68);
    }
    if (Attribs->NumVertexStreams <= (uint)msg.field_2._12_4_) {
      local_9c = msg.field_2._12_4_ + 1;
      local_a8 = "";
      if (msg.field_2._12_4_ != 0) {
        local_a8 = "s";
      }
      local_a9 = 0x20;
      SrcStream = (VertexStreamInfo<Diligent::BufferGLImpl> *)0xf53f6e;
      if (Attribs->NumVertexStreams == 1) {
        SrcStream = (VertexStreamInfo<Diligent::BufferGLImpl> *)0xf51cc6;
      }
      in_R8 = (char (*) [36])&local_a8;
      FormatString<char[32],unsigned_int,char[8],char_const*,char[12],unsigned_int,char,char_const*,char[8]>
                ((string *)local_98,(Diligent *)"Input layout requires at least ",
                 (char (*) [32])&local_9c,(uint *)0xe6e559,(char (*) [8])in_R8,(char **)0xf4cae4,
                 (char (*) [12])&Attribs->NumVertexStreams,(uint *)&local_a9,(char *)&SrcStream,
                 (char **)0xe565a0,in_stack_fffffffffffffe78);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VAOHashKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                 ,0xc0);
      std::__cxx11::string::~string((string *)local_98);
    }
    msg_2.field_2._8_8_ = Attribs->VertexStreams + (uint)msg.field_2._12_4_;
    bVar2 = RefCntAutoPtr<Diligent::BufferGLImpl>::operator!
                      ((RefCntAutoPtr<Diligent::BufferGLImpl> *)msg_2.field_2._8_8_);
    if (bVar2) {
      FormatString<char[29],unsigned_int,char[36]>
                ((string *)&SlotBit,(Diligent *)"VAO requires buffer at slot ",
                 (char (*) [29])((long)&msg.field_2 + 0xc),
                 (uint *)", but none is bound in the context.",in_R8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"VAOHashKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                 ,0xc3);
      std::__cxx11::string::~string((string *)&SlotBit);
    }
    bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)msg_2.field_2._8_8_);
    if (bVar2) {
      this_00 = RefCntAutoPtr<Diligent::BufferGLImpl>::operator->
                          ((RefCntAutoPtr<Diligent::BufferGLImpl> *)msg_2.field_2._8_8_);
      local_16c = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                  ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                                 *)this_00);
    }
    else {
      local_16c = 0;
    }
    uVar8 = 1 << ((byte)msg.field_2._12_4_ & 0x1f);
    if ((this->UsedSlotsMask & uVar8) == 0) {
      FirstArg = this->Streams + (uint)msg.field_2._12_4_;
      FirstArg->BufferUId = local_16c;
      FirstArg->Offset = *(Uint64 *)(msg_2.field_2._8_8_ + 8);
      this->UsedSlotsMask = uVar8 | this->UsedSlotsMask;
      HashCombine<int,unsigned_long>(&this->Hash,&FirstArg->BufferUId,&FirstArg->Offset);
    }
    else {
      uVar7 = (ulong)(uint)msg.field_2._12_4_;
      if (this->Streams[uVar7].BufferUId != local_16c) {
        FormatString<char[26],char[30]>
                  ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DstStream.BufferUId == BuffId",(char (*) [30])(uVar7 * 0x10));
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xd3);
        std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      }
      if (this->Streams[uVar7].Offset != *(Uint64 *)(msg_2.field_2._8_8_ + 8)) {
        FormatString<char[26],char[37]>
                  ((string *)local_138,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DstStream.Offset == SrcStream.Offset",
                   (char (*) [37])msg_2.field_2._8_8_);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xd4);
        std::__cxx11::string::~string((string *)local_138);
      }
    }
  }
  HashCombine<unsigned_int>(&this->Hash,&this->UsedSlotsMask);
  return;
}

Assistant:

VAOCache::VAOHashKey::VAOHashKey(const VAOAttribs& Attribs) :
    // clang-format off
    PsoUId         {Attribs.PSO.GetUniqueID()},
    IndexBufferUId {Attribs.pIndexBuffer ? Attribs.pIndexBuffer->GetUniqueID() : 0}
// clang-format on
{
#ifdef DILIGENT_DEBUG
    for (Uint32 i = 0; i < _countof(Streams); ++i)
        Streams[i].BufferUId = -1;
#endif

    const auto& InputLayout    = Attribs.PSO.GetGraphicsPipelineDesc().InputLayout;
    const auto* LayoutElements = InputLayout.LayoutElements;

    Hash = ComputeHash(PsoUId, IndexBufferUId);
    for (Uint32 i = 0; i < InputLayout.NumElements; ++i)
    {
        const auto& LayoutElem = LayoutElements[i];
        const auto  BufferSlot = LayoutElem.BufferSlot;
        VERIFY_EXPR(BufferSlot < MAX_BUFFER_SLOTS);
        DEV_CHECK_ERR(BufferSlot < Attribs.NumVertexStreams, "Input layout requires at least ", BufferSlot + 1,
                      " buffer", (BufferSlot > 0 ? "s" : ""), ", but only ", Attribs.NumVertexStreams, ' ',
                      (Attribs.NumVertexStreams == 1 ? "is" : "are"), " bound.");

        const auto& SrcStream = Attribs.VertexStreams[BufferSlot];
        DEV_CHECK_ERR(SrcStream.pBuffer, "VAO requires buffer at slot ", BufferSlot, ", but none is bound in the context.");

        const auto BuffId  = SrcStream.pBuffer ? SrcStream.pBuffer->GetUniqueID() : 0;
        const auto SlotBit = 1u << BufferSlot;
        if ((UsedSlotsMask & SlotBit) == 0)
        {
            auto& DstStream     = Streams[BufferSlot];
            DstStream.BufferUId = BuffId;
            DstStream.Offset    = SrcStream.Offset;
            UsedSlotsMask |= SlotBit;
            HashCombine(Hash, DstStream.BufferUId, DstStream.Offset);
        }
        else
        {
            const auto& DstStream = Streams[BufferSlot];
            // The slot has already been initialized
            VERIFY_EXPR(DstStream.BufferUId == BuffId);
            VERIFY_EXPR(DstStream.Offset == SrcStream.Offset);
        }
    }
    HashCombine(Hash, UsedSlotsMask);
}